

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_poll.cpp
# Opt level: O0

void * poll_routine(void *arg)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  bool bVar4;
  int iSock;
  uint uVar5;
  size_type sVar6;
  reference pvVar7;
  stCoRoutine_t *psVar8;
  uint *puVar9;
  int *piVar10;
  char *pcVar11;
  pollfd *__fds;
  size_type sVar12;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar13;
  ulong local_b8;
  size_t i_4;
  _Self local_a8;
  ulong local_a0;
  size_t i_3;
  undefined1 local_90;
  int local_88;
  int i_2;
  uint local_74;
  nfds_t nStack_70;
  int ret_1;
  size_t iWaitCnt;
  set<int,_std::less<int>,_std::allocator<int>_> setRaiseFds;
  size_t i_1;
  pollfd *pf;
  int ret;
  int fd;
  size_t i;
  vector<task_t,_std::allocator<task_t>_> *v;
  void *arg_local;
  
  co_enable_hook_sys();
  for (_ret = 0;
      sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                        ((vector<task_t,_std::allocator<task_t>_> *)arg), _ret < sVar6;
      _ret = _ret + 1) {
    iSock = CreateTcpSocket(0,"*",false);
    SetNonBlock(iSock);
    pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                       ((vector<task_t,_std::allocator<task_t>_> *)arg,_ret);
    pvVar7->fd = iSock;
    pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                       ((vector<task_t,_std::allocator<task_t>_> *)arg,_ret);
    uVar5 = connect(iSock,(sockaddr *)&pvVar7->addr,0x10);
    psVar8 = co_self();
    puVar9 = (uint *)__errno_location();
    uVar1 = *puVar9;
    piVar10 = __errno_location();
    pcVar11 = strerror(*piVar10);
    printf("co %p connect i %ld ret %d errno %d (%s)\n",psVar8,_ret,(ulong)uVar5,(ulong)uVar1,
           pcVar11);
  }
  sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                    ((vector<task_t,_std::allocator<task_t>_> *)arg);
  __fds = (pollfd *)calloc(1,sVar6 << 3);
  for (setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sVar3 = setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count,
      sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                        ((vector<task_t,_std::allocator<task_t>_> *)arg), sVar3 < sVar6;
      setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count =
           setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                       ((vector<task_t,_std::allocator<task_t>_> *)arg,
                        setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __fds[setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count].fd = pvVar7->fd;
    __fds[setRaiseFds._M_t._M_impl.super__Rb_tree_header._M_node_count].events = 0x1c;
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt);
  nStack_70 = std::vector<task_t,_std::allocator<task_t>_>::size
                        ((vector<task_t,_std::allocator<task_t>_> *)arg);
  while( true ) {
    local_74 = poll(__fds,nStack_70,1000);
    psVar8 = co_self();
    printf("co %p poll wait %ld ret %d\n",psVar8,nStack_70,(ulong)local_74);
    for (local_88 = 0; local_88 < (int)nStack_70; local_88 = local_88 + 1) {
      psVar8 = co_self();
      printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",psVar8,
             (ulong)(uint)__fds[local_88].fd,(ulong)(uint)(int)__fds[local_88].revents,4,8,0x10);
      pVar13 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt,
                          &__fds[local_88].fd);
      i_3 = (size_t)pVar13.first._M_node;
      local_90 = pVar13.second;
    }
    sVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt);
    sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                      ((vector<task_t,_std::allocator<task_t>_> *)arg);
    if ((sVar12 == sVar6) || ((int)local_74 < 1)) break;
    nStack_70 = 0;
    for (local_a0 = 0; uVar2 = local_a0,
        sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                          ((vector<task_t,_std::allocator<task_t>_> *)arg), uVar2 < sVar6;
        local_a0 = local_a0 + 1) {
      pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                         ((vector<task_t,_std::allocator<task_t>_> *)arg,local_a0);
      local_a8._M_node =
           (_Base_ptr)
           std::set<int,_std::less<int>,_std::allocator<int>_>::find
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt,&pvVar7->fd);
      i_4 = (size_t)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt);
      bVar4 = std::operator==(&local_a8,(_Self *)&i_4);
      if (bVar4) {
        pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                           ((vector<task_t,_std::allocator<task_t>_> *)arg,local_a0);
        __fds[nStack_70].fd = pvVar7->fd;
        __fds[nStack_70].events = 0x1c;
        nStack_70 = nStack_70 + 1;
      }
    }
  }
  for (local_b8 = 0;
      sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                        ((vector<task_t,_std::allocator<task_t>_> *)arg), local_b8 < sVar6;
      local_b8 = local_b8 + 1) {
    pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                       ((vector<task_t,_std::allocator<task_t>_> *)arg,local_b8);
    close(pvVar7->fd);
    pvVar7 = std::vector<task_t,_std::allocator<task_t>_>::operator[]
                       ((vector<task_t,_std::allocator<task_t>_> *)arg,local_b8);
    pvVar7->fd = -1;
  }
  psVar8 = co_self();
  sVar6 = std::vector<task_t,_std::allocator<task_t>_>::size
                    ((vector<task_t,_std::allocator<task_t>_> *)arg);
  sVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                     ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt);
  printf("co %p task cnt %ld fire %ld\n",psVar8,sVar6,sVar12);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&iWaitCnt);
  return (void *)0x0;
}

Assistant:

static void *poll_routine( void *arg )
{
	co_enable_hook_sys();

	vector<task_t> &v = *(vector<task_t>*)arg;
	for(size_t i=0;i<v.size();i++)
	{
		int fd = CreateTcpSocket();
		SetNonBlock( fd );
		v[i].fd = fd;

		int ret = connect(fd,(struct sockaddr*)&v[i].addr,sizeof( v[i].addr )); 
		printf("co %p connect i %ld ret %d errno %d (%s)\n",
			co_self(),i,ret,errno,strerror(errno));
	}
	struct pollfd *pf = (struct pollfd*)calloc( 1,sizeof(struct pollfd) * v.size() );

	for(size_t i=0;i<v.size();i++)
	{
		pf[i].fd = v[i].fd;
		pf[i].events = ( POLLOUT | POLLERR | POLLHUP );
	}
	set<int> setRaiseFds;
	size_t iWaitCnt = v.size();
	for(;;)
	{
		int ret = poll( pf,iWaitCnt,1000 );
		printf("co %p poll wait %ld ret %d\n",
				co_self(),iWaitCnt,ret);
		for(int i=0;i<(int)iWaitCnt;i++)
		{
			printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",
					co_self(),
					pf[i].fd,
					pf[i].revents,
					POLLOUT,
					POLLERR,
					POLLHUP
					);
			setRaiseFds.insert( pf[i].fd );
		}
		if( setRaiseFds.size() == v.size())
		{
			break;
		}
		if( ret <= 0 )
		{
			break;
		}

		iWaitCnt = 0;
		for(size_t i=0;i<v.size();i++)
		{
			if( setRaiseFds.find( v[i].fd ) == setRaiseFds.end() )
			{
				pf[ iWaitCnt ].fd = v[i].fd;
				pf[ iWaitCnt ].events = ( POLLOUT | POLLERR | POLLHUP );
				++iWaitCnt;
			}
		}
	}
	for(size_t i=0;i<v.size();i++)
	{
		close( v[i].fd );
		v[i].fd = -1;
	}

	printf("co %p task cnt %ld fire %ld\n",
			co_self(),v.size(),setRaiseFds.size() );
	return 0;
}